

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * __thiscall
ODDLParser::OpenDDLParser::parseStructureBody(OpenDDLParser *this,char *in,char *end,bool *error)

{
  ValueType type_00;
  char *pcVar1;
  ostream *poVar2;
  pointer ppDVar3;
  pointer ppDVar4;
  DDLNode *pDVar5;
  DataArrayList *dtArrayList;
  Value *values;
  size_t arrayLen;
  ValueType type;
  Reference *refs;
  size_t numValues;
  DataArrayList *local_78;
  Value *local_70;
  size_t local_68;
  ValueType local_5c;
  string local_58;
  size_t local_38;
  size_t local_30;
  
  pcVar1 = lookForNextToken<char>
                     (in + ((byte)((*in & 0xdfU) + 0xa5) < 0xe6 && (byte)(*in - 0x3aU) < 0xf6),end);
  local_5c = ddl_none;
  local_68 = 0;
  pcVar1 = parsePrimitiveDataType(pcVar1,end,&local_5c,&local_68);
  type_00 = local_5c;
  if (local_5c != ddl_none) {
    pcVar1 = lookForNextToken<char>(pcVar1,end);
    if (*pcVar1 == '{') {
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_78 = (DataArrayList *)0x0;
      local_70 = (Value *)0x0;
      if (local_68 == 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"0 for array is invalid.");
        std::endl<char,std::char_traits<char>>(poVar2);
        *error = true;
      }
      else if (local_68 == 1) {
        local_38 = 0;
        pcVar1 = parseDataList(pcVar1,end,type_00,&local_70,&local_38,(Reference **)&local_58,
                               &local_30);
        ppDVar4 = (this->m_stack).
                  super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppDVar3 = (this->m_stack).
                  super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (ppDVar4 == ppDVar3) {
          pDVar5 = (DDLNode *)0x0;
        }
        else {
          pDVar5 = ppDVar3[-1];
        }
        if (pDVar5 != (DDLNode *)0x0 && local_70 != (Value *)0x0) {
          DDLNode::setValue(pDVar5,local_70);
          ppDVar4 = (this->m_stack).
                    super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppDVar3 = (this->m_stack).
                    super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        if (ppDVar4 == ppDVar3) {
          pDVar5 = (DDLNode *)0x0;
        }
        else {
          pDVar5 = ppDVar3[-1];
        }
        if (pDVar5 != (DDLNode *)0x0 && (Reference *)local_58._M_dataplus._M_p != (Reference *)0x0)
        {
          DDLNode::setReferences(pDVar5,(Reference *)local_58._M_dataplus._M_p);
        }
      }
      else {
        pcVar1 = parseDataArrayList(pcVar1,end,type_00,&local_78);
        ppDVar4 = (this->m_stack).
                  super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((this->m_stack).
            super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start == ppDVar4) {
          pDVar5 = (DDLNode *)0x0;
        }
        else {
          pDVar5 = ppDVar4[-1];
        }
        if (pDVar5 != (DDLNode *)0x0 && local_78 != (DataArrayList *)0x0) {
          DDLNode::setDataArrayList(pDVar5,local_78);
        }
      }
    }
    pcVar1 = lookForNextToken<char>(pcVar1,end);
    if (*pcVar1 != '}') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"}",(allocator<char> *)&local_78);
      logInvalidTokenError(pcVar1,&local_58,this->m_logCallback);
      std::__cxx11::string::~string((string *)&local_58);
      pcVar1 = (char *)0x0;
    }
    return pcVar1;
  }
  pcVar1 = parseNextNode(this,pcVar1,end);
  return pcVar1;
}

Assistant:

char *OpenDDLParser::parseStructureBody( char *in, char *end, bool &error ) {
    if( !isNumeric( *in ) && !isCharacter( *in ) ) {
        ++in;
    }

    in = lookForNextToken( in, end );
    Value::ValueType type( Value::ddl_none );
    size_t arrayLen( 0 );
    in = OpenDDLParser::parsePrimitiveDataType( in, end, type, arrayLen );
    if( Value::ddl_none != type ) {
        // parse a primitive data type
        in = lookForNextToken( in, end );
        if( *in == Grammar::OpenBracketToken[ 0 ] ) {
            Reference *refs( ddl_nullptr );
            DataArrayList *dtArrayList( ddl_nullptr );
            Value *values( ddl_nullptr );
            if( 1 == arrayLen ) {
                size_t numRefs( 0 ), numValues( 0 );
                in = parseDataList( in, end, type, &values, numValues, &refs, numRefs );
                setNodeValues( top(), values );
                setNodeReferences( top(), refs );
            } else if( arrayLen > 1 ) {
                in = parseDataArrayList( in, end, type, &dtArrayList );
                setNodeDataArrayList( top(), dtArrayList );
            } else {
                std::cerr << "0 for array is invalid." << std::endl;
                error = true;
            }
        }

        in = lookForNextToken( in, end );
        if( *in != '}' ) {
            logInvalidTokenError( in, std::string( Grammar::CloseBracketToken ), m_logCallback );
            return ddl_nullptr;
        } else {
            //in++;
        }
    } else {
        // parse a complex data type
        in = parseNextNode( in, end );
    }

    return in;
}